

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BringWindowToFocusFront(ImGuiWindow *window)

{
  int iVar1;
  ImGuiWindow **ppIVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  ulong uVar5;
  uint uVar6;
  
  pIVar4 = GImGui;
  if ((GImGui->WindowsFocusOrder).Size < 1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x60e,"back","ImGui ASSERT FAILED: %s","Size > 0");
  }
  iVar1 = (pIVar4->WindowsFocusOrder).Size;
  if ((pIVar4->WindowsFocusOrder).Data[(long)iVar1 + -1] != window && 1 < (long)iVar1) {
    uVar5 = (ulong)(iVar1 - 1);
    uVar6 = iVar1 - 2;
    do {
      if ((pIVar4->WindowsFocusOrder).Size <= (int)uVar6) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      if ((pIVar4->WindowsFocusOrder).Data[uVar6] == window) {
        if ((pIVar4->WindowsFocusOrder).Size <= (int)uVar6) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        ppIVar2 = (pIVar4->WindowsFocusOrder).Data;
        if ((pIVar4->WindowsFocusOrder).Size <= (int)(uVar6 + 1)) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        memmove(ppIVar2 + uVar6,(pIVar4->WindowsFocusOrder).Data + uVar5,
                (long)((pIVar4->WindowsFocusOrder).Size - (int)uVar5) << 3);
        (pIVar4->WindowsFocusOrder).Data[(long)(pIVar4->WindowsFocusOrder).Size + -1] = window;
        return;
      }
      uVar5 = uVar5 - 1;
      bVar3 = 0 < (int)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void ImGui::BringWindowToFocusFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.WindowsFocusOrder.back() == window)
        return;
    for (int i = g.WindowsFocusOrder.Size - 2; i >= 0; i--) // We can ignore the top-most window
        if (g.WindowsFocusOrder[i] == window)
        {
            memmove(&g.WindowsFocusOrder[i], &g.WindowsFocusOrder[i + 1], (size_t)(g.WindowsFocusOrder.Size - i - 1) * sizeof(ImGuiWindow*));
            g.WindowsFocusOrder[g.WindowsFocusOrder.Size - 1] = window;
            break;
        }
}